

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O0

void help(void)

{
  ostream *poVar1;
  void *pvVar2;
  int local_18c;
  duration<long,_std::ratio<1L,_1000L>_> local_188;
  int local_17c;
  duration<long,_std::ratio<1L,_1000L>_> local_178;
  int local_16c;
  duration<long,_std::ratio<1L,_1000L>_> local_168;
  int local_15c;
  duration<long,_std::ratio<1L,_1000L>_> local_158;
  int local_14c;
  duration<long,_std::ratio<1L,_1000L>_> local_148;
  int local_13c;
  duration<long,_std::ratio<1L,_1000L>_> local_138;
  int local_12c;
  duration<long,_std::ratio<1L,_1000L>_> local_128;
  int local_11c;
  duration<long,_std::ratio<1L,_1000L>_> local_118;
  int local_10c;
  duration<long,_std::ratio<1L,_1000L>_> local_108;
  int local_fc;
  duration<long,_std::ratio<1L,_1000L>_> local_f8;
  int local_ec;
  duration<long,_std::ratio<1L,_1000L>_> local_e8;
  int local_dc;
  duration<long,_std::ratio<1L,_1000L>_> local_d8;
  int local_cc;
  duration<long,_std::ratio<1L,_1000L>_> local_c8;
  int local_bc;
  duration<long,_std::ratio<1L,_1000L>_> local_b8;
  int local_ac;
  duration<long,_std::ratio<1L,_1000L>_> local_a8;
  int local_9c;
  duration<long,_std::ratio<1L,_1000L>_> local_98;
  int local_8c;
  duration<long,_std::ratio<1L,_1000L>_> local_88 [3];
  allocator local_69;
  string local_68 [32];
  string local_48 [36];
  int local_24;
  duration<long,std::ratio<1l,1000l>> local_20 [12];
  int local_14;
  duration<long,std::ratio<1l,1000l>> local_10 [8];
  
  local_14 = 300;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_10,&local_14);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)local_10);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "------------------------------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_10fa3);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_24 = 800;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_20,&local_24);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,anon_var_dwarf_10fb9,&local_69);
  yellow_text(local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_48);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_8c = 800;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)local_88,&local_8c);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(local_88);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_10fcf);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  local_9c = 800;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_98,&local_9c);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_98);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_10fd9);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  local_ac = 800;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_a8,&local_ac);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_a8);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_10fef);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  local_bc = 800;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_b8,&local_bc);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_b8);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_11005);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  local_cc = 800;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_c8,&local_cc);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_c8);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1101b);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  local_dc = 300;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_d8,&local_dc);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_d8);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "------------------------------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  pause();
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_11031);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  local_ec = 900;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_e8,&local_ec);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_e8);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1103b);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_11051);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  local_fc = 900;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_f8,&local_fc);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_f8);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_11067);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1107d);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  local_10c = 900;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_108,&local_10c);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_108);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_11093);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_110a9);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  local_11c = 900;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_118,&local_11c);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_118);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_110bf);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_110d5);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  local_12c = 900;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_128,&local_12c);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_128);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_110eb);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_110f5);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  local_13c = 900;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_138,&local_13c);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_138);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1110b);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_11115);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  local_14c = 900;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_148,&local_14c);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_148);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1112b);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_11135);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  local_15c = 900;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_158,&local_15c);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_158);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1114b);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_11155);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  pause();
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "------------------------------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1116b);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_16c = 800;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_168,&local_16c);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_168);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_11181);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  local_17c = 800;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_178,&local_17c);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_178);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_11197);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_111ad);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_111b7);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  pause();
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "------------------------------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_111c1);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_111cb);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_111d5);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_111df);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_111f5);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1120b);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_11215);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1122b);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_11235);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1124b);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_11255);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1126b);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_11275);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  local_18c = 1000;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_188,&local_18c);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_188);
  pause();
  return;
}

Assistant:

void help(){
    this_thread::sleep_for(chrono::milliseconds(300));
    cout<<endl;
    cout<<"------------------------------------------------------------"<<endl;
    cout<<"遊戲方式:"<<endl;
    this_thread::sleep_for(chrono::milliseconds(800));
    cout<<yellow_text("\t輸入技能之代號或名稱即可攻擊")<<endl<<endl;
    this_thread::sleep_for(chrono::milliseconds(800));
    cout<<"\t普通攻擊: 造成基礎傷害乘以傷害係數的傷害"<<endl<<endl;
    this_thread::sleep_for(chrono::milliseconds(800));
    cout<<"\t雙重普通攻擊: 攻擊2次，但傷害減半，傷害係數各自分開計算"<<endl<<endl;
    this_thread::sleep_for(chrono::milliseconds(800));
    cout<<"\t防禦: 該回合不進行任何動作，抵擋住惡龍之60%的傷害"<<endl<<endl;
    this_thread::sleep_for(chrono::milliseconds(800));
    cout<<"\t傷害係數: 可能是0.90、0.95、1.00、1.05、1.10或1.80(暴擊)"<<endl<<endl;
    this_thread::sleep_for(chrono::milliseconds(800));
    cout<<"\t技能之冷卻時間(CD)到0即可再次使用該技能"<<endl;
    cout<<endl;
    this_thread::sleep_for(chrono::milliseconds(300));
    cout<<"------------------------------------------------------------"<<endl;
    pause();
    cout<<"技能介紹:"<<endl<<endl;
    this_thread::sleep_for(chrono::milliseconds(900));
    cout<<"freeze(冰凍 CD-18):"<<endl<<endl;
    cout<<"\t冰凍惡龍3回合(包括當前回合)，使惡龍無法行動"<<endl<<endl;
    this_thread::sleep_for(chrono::milliseconds(900));
    cout<<"fire(燃燒 CD-9):"<<endl<<endl;
    cout<<"\t接下來的5回合(包括當前回合)，對惡龍造成攻擊之40%的傷害"<<endl<<endl;
    this_thread::sleep_for(chrono::milliseconds(900));
    cout<<"swipe(重擊 CD-5):"<<endl<<endl;
    cout<<"\t該回合對惡龍造成攻擊力3倍之傷害(無法再與暴擊加成)"<<endl<<endl;
    this_thread::sleep_for(chrono::milliseconds(900));
    cout<<"dizzy(暈眩 CD-13):"<<endl<<endl;
    cout<<"\t接下來的4回合(包括當前回合)，惡龍有40%的機率傷害自己"<<endl<<endl;
    this_thread::sleep_for(chrono::milliseconds(900));
    cout<<"blood(吸血 CD-27):"<<endl<<endl;
    cout<<"\t接下來的3回合(包括當前回合)，將惡龍當前生命之3%，轉成自己的血量"<<endl<<endl;
    this_thread::sleep_for(chrono::milliseconds(900));
    cout<<"shield(護盾 CD-16):"<<endl<<endl;
    cout<<"\t接下來的3回合(包括當前回合)，免疫惡龍的所有傷害"<<endl<<endl;
    this_thread::sleep_for(chrono::milliseconds(900));
    cout<<"cure(治癒 CD-20):"<<endl<<endl;
    cout<<"\t該回合回復最大生命之40%"<<endl<<endl;
    this_thread::sleep_for(chrono::milliseconds(900));
    cout<<"treat(回復 CD-14):"<<endl<<endl;
    cout<<"\t接下來的3回合(包括當前回合)，回復已損生命之20%"<<endl<<endl;
    cout<<endl;
    pause();
    cout<<"------------------------------------------------------------"<<endl;
    cout<<"怒氣值(AP):"<<endl;
    this_thread::sleep_for(chrono::milliseconds(800));
    cout<<"\t每回合加1，若惡龍該回合暴擊則再加1，到10則可以使用必殺技pow"<<endl<<endl;
    this_thread::sleep_for(chrono::milliseconds(800));
    cout<<"pow(必殺技):"<<endl;
    cout<<"\t使用後怒氣值減10，該回合對惡龍造成攻擊力5倍之傷害，"<<endl;
    cout<<"\t並有70%機率在當前回合定身惡龍"<<endl<<endl;
    cout<<endl;
    pause();
    cout<<"------------------------------------------------------------"<<endl;
    cout<<"惡龍技能:"<<endl<<endl;
    cout<<"龍之吐息:"<<endl<<endl;
    cout<<"\t無視防禦及護盾效果，對勇者造成其最大生命值8%傷害"<<endl<<endl;
    cout<<"弱化:"<<endl<<endl;
    cout<<"\t接下來的3回合，勇者的攻擊力弱化30%，受到傷害提升10%"<<endl<<endl;
    cout<<"反彈:"<<endl<<endl;
    cout<<"\t下一回合，反彈勇者的攻擊傷害之40%，再下一回合反彈2倍傷害"<<endl<<endl;
    cout<<"毒氣:"<<endl<<endl;
    cout<<"\t接下來的5回合(包括當前回合)，對勇者造成攻擊30%之傷害。\n\t中毒傷害無視防禦及護盾效果"<<endl<<endl;
    cout<<"連擊:"<<endl<<endl;
    cout<<"\t該回合對勇者造成連續5次惡龍攻擊力45%之傷害"<<endl<<endl;
    cout<<"毀滅龍盾:"<<endl<<endl;
    cout<<"\t增加自身最大血量20%之護盾，且該護盾只能以物理攻擊破壞。\n\t若勇者在3回合內未能打掉護盾，勇者死亡"<<endl<<endl;
    cout<<endl;
    this_thread::sleep_for(chrono::milliseconds(1000));
    pause();
}